

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datapiece.cc
# Opt level: O1

StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
google::protobuf::util::converter::DataPiece::ToString_abi_cxx11_
          (StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,DataPiece *this)

{
  char *pcVar1;
  StringPiece error_message;
  string *in_RCX;
  StringPiece src;
  StringPiece default_string;
  string local_78;
  size_type *local_58;
  string base64;
  
  if (this->type_ == TYPE_BYTES) {
    local_58 = &base64._M_string_length;
    base64._M_dataplus._M_p = (pointer)0x0;
    base64._M_string_length._0_1_ = 0;
    pcVar1 = (char *)(this->field_2).str_.size_;
    if ((long)pcVar1 < 0) {
      __assert_fail("len >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/stubs/stringpiece.h"
                    ,0xe6,
                    "google::protobuf::StringPiece::StringPiece(const char *, stringpiece_ssize_type)"
                   );
    }
    src.length_ = (stringpiece_ssize_type)&stack0xffffffffffffffa8;
    src.ptr_ = pcVar1;
    Base64Escape((protobuf *)(this->field_2).str_.data_,src,in_RCX);
    Status::Status(&__return_storage_ptr__->status_);
    (__return_storage_ptr__->value_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->value_).field_2;
    (__return_storage_ptr__->value_)._M_string_length = 0;
    (__return_storage_ptr__->value_).field_2._M_local_buf[0] = '\0';
    Status::operator=(&__return_storage_ptr__->status_,(Status *)Status::OK);
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->value_);
  }
  else {
    if (this->type_ != TYPE_STRING) {
      default_string.length_ = 0x19;
      default_string.ptr_ = "Cannot convert to string.";
      ValueAsStringOrDefault_abi_cxx11_(&local_78,this,default_string);
      error_message.length_ = local_78._M_string_length;
      error_message.ptr_ = local_78._M_dataplus._M_p;
      if ((long)local_78._M_string_length < 0) {
        StringPiece::LogFatalSizeTooBig(local_78._M_string_length,"size_t to int conversion");
      }
      Status::Status((Status *)&stack0xffffffffffffffa8,INVALID_ARGUMENT,error_message);
      StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      StatusOr(__return_storage_ptr__,(Status *)&stack0xffffffffffffffa8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)base64._M_dataplus._M_p != &base64.field_2) {
        operator_delete(base64._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == &local_78.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_0030df1a;
    }
    pcVar1 = (this->field_2).str_.data_;
    local_58 = &base64._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffffa8,pcVar1,pcVar1 + (this->field_2).str_.size_);
    Status::Status(&__return_storage_ptr__->status_);
    (__return_storage_ptr__->value_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->value_).field_2;
    (__return_storage_ptr__->value_)._M_string_length = 0;
    (__return_storage_ptr__->value_).field_2._M_local_buf[0] = '\0';
    Status::operator=(&__return_storage_ptr__->status_,(Status *)Status::OK);
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->value_);
  }
  local_78._M_dataplus._M_p = (pointer)local_58;
  if (local_58 == &base64._M_string_length) {
    return __return_storage_ptr__;
  }
LAB_0030df1a:
  operator_delete(local_78._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

StatusOr<std::string> DataPiece::ToString() const {
  switch (type_) {
    case TYPE_STRING:
      return std::string(str_);
    case TYPE_BYTES: {
      std::string base64;
      Base64Escape(str_, &base64);
      return base64;
    }
    default:
      return InvalidArgument(
          ValueAsStringOrDefault("Cannot convert to string."));
  }
}